

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGjkEpa2.cpp
# Opt level: O1

cbtScalar gjkepa2_impl::GJK::projectorigin
                    (cbtVector3 *a,cbtVector3 *b,cbtVector3 *c,cbtScalar *w,U *m)

{
  uint uVar1;
  cbtVector3 *pcVar2;
  undefined1 auVar3 [16];
  float fVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint uVar10;
  long lVar11;
  cbtScalar cVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [64];
  cbtScalar cVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  U subm;
  cbtScalar subw [2];
  cbtVector3 dl [3];
  cbtVector3 *vt [3];
  U local_b4;
  cbtScalar local_b0 [3];
  float local_a4;
  float local_a0;
  float local_9c;
  cbtVector3 *local_98;
  U *local_90;
  undefined1 local_88 [4];
  float afStack_84 [3];
  undefined1 local_78 [8];
  float fStack_70;
  float fStack_68;
  float fStack_64;
  float fStack_60;
  cbtVector3 *local_58;
  cbtVector3 *local_50;
  cbtVector3 *local_48 [3];
  
  local_48[0] = a;
  local_48[1] = b;
  local_48[2] = c;
  auVar22 = vinsertps_avx(ZEXT416((uint)(a->m_floats[0] - b->m_floats[0])),
                          ZEXT416((uint)(a->m_floats[1] - b->m_floats[1])),0x10);
  _local_88 = vinsertps_avx(auVar22,ZEXT416((uint)(a->m_floats[2] - b->m_floats[2])),0x28);
  auVar8 = _local_88;
  auVar22 = vinsertps_avx(ZEXT416((uint)(b->m_floats[0] - c->m_floats[0])),
                          ZEXT416((uint)(b->m_floats[1] - c->m_floats[1])),0x10);
  auVar19._20_8_ = SUB128(ZEXT812(0),4);
  auVar19._16_4_ = b->m_floats[2] - c->m_floats[2];
  auVar3 = vinsertps_avx(ZEXT416((uint)(c->m_floats[0] - a->m_floats[0])),
                         ZEXT416((uint)(c->m_floats[1] - a->m_floats[1])),0x10);
  auVar17._16_16_ = auVar3;
  auVar17._0_16_ = auVar22;
  auVar18._20_8_ = SUB128(ZEXT812(0),4);
  auVar18._16_4_ = c->m_floats[2] - a->m_floats[2];
  auVar18._0_16_ = auVar22;
  auVar18._28_4_ = 0;
  auVar19._0_16_ = auVar22;
  auVar19._28_4_ = 0;
  auVar18 = vperm2f128_avx(auVar19,auVar18,0x31);
  _local_78 = vunpcklpd_avx(auVar17,auVar18);
  auVar18 = _local_78;
  auVar3 = vfmsub231ss_fma(ZEXT416((uint)((float)local_78._4_4_ * afStack_84[1])),
                           ZEXT416((uint)afStack_84[0]),ZEXT416((uint)fStack_70));
  auVar20 = ZEXT1664(auVar3);
  auVar22 = vfmsub231ss_fma(ZEXT416((uint)(fStack_70 * (float)local_88)),
                            ZEXT416((uint)local_78._0_4_),ZEXT416((uint)afStack_84[1]));
  auVar23 = ZEXT1664(auVar22);
  auVar7 = vfmsub231ss_fma(ZEXT416((uint)((float)local_78._0_4_ * afStack_84[0])),
                           ZEXT416((uint)local_78._4_4_),ZEXT416((uint)local_88));
  auVar24 = ZEXT1664(auVar7);
  fVar16 = auVar22._0_4_;
  auVar22 = vfmadd231ss_fma(ZEXT416((uint)(fVar16 * fVar16)),auVar3,auVar3);
  auVar22 = vfmadd231ss_fma(auVar22,auVar7,auVar7);
  fVar14 = auVar22._0_4_;
  if (fVar14 <= 0.0) {
    cVar21 = -1.0;
  }
  else {
    local_a4 = (float)local_78._4_4_;
    local_a0 = fStack_70;
    local_9c = (float)local_78._0_4_;
    local_58 = a;
    local_b0[0] = 0.0;
    local_b0[1] = 0.0;
    local_b4 = 0;
    cVar21 = -1.0;
    lVar11 = 0;
    uVar10 = 0;
    local_98 = c;
    local_90 = m;
    _local_88 = auVar8;
    _local_78 = auVar18;
    local_50 = b;
    do {
      pcVar2 = *(cbtVector3 **)((long)local_48 + lVar11 * 2);
      auVar22 = vfmsub231ss_fma(ZEXT416((uint)(auVar23._0_4_ * *(float *)(local_88 + lVar11 * 4 + 8)
                                              )),
                                ZEXT416((uint)*(float *)(local_88 + lVar11 * 4 + 4)),auVar24._0_16_)
      ;
      auVar8 = vfmsub231ss_fma(ZEXT416((uint)(auVar24._0_4_ * *(float *)(local_88 + lVar11 * 4))),
                               auVar20._0_16_,ZEXT416((uint)*(float *)(local_88 + lVar11 * 4 + 8)));
      auVar9 = vfmsub231ss_fma(ZEXT416((uint)(auVar20._0_4_ * *(float *)(local_88 + lVar11 * 4 + 4))
                                      ),auVar23._0_16_,
                               ZEXT416((uint)*(float *)(local_88 + lVar11 * 4)));
      auVar22 = vfmadd231ss_fma(ZEXT416((uint)(auVar8._0_4_ * pcVar2->m_floats[1])),auVar22,
                                ZEXT416((uint)pcVar2->m_floats[0]));
      auVar22 = vfmadd231ss_fma(auVar22,auVar9,ZEXT416((uint)pcVar2->m_floats[2]));
      if (0.0 < auVar22._0_4_) {
        uVar1 = *(uint *)((long)projectorigin::imd3 + lVar11);
        cVar12 = projectorigin(pcVar2,local_48[uVar1],local_b0,&local_b4);
        auVar24 = ZEXT464(auVar7._0_4_);
        auVar23 = ZEXT464((uint)fVar16);
        auVar20 = ZEXT464(auVar3._0_4_);
        if ((cVar21 < 0.0) || (cVar12 < cVar21)) {
          *local_90 = (1 << (uVar1 & 0x1f) & (int)(local_b4 << 0x1e) >> 0x1f) +
                      (1 << (uVar10 & 0x1f) & -(local_b4 & 1));
          *(cbtScalar *)((long)w + lVar11) = local_b0[0];
          w[uVar1] = local_b0[1];
          w[projectorigin::imd3[uVar1]] = 0.0;
          cVar21 = cVar12;
        }
      }
      auVar22 = auVar24._0_16_;
      uVar10 = uVar10 + 1;
      lVar11 = lVar11 + 4;
    } while (lVar11 != 0xc);
    if (cVar21 < 0.0) {
      auVar8 = vfmadd231ss_fma(ZEXT416((uint)(auVar23._0_4_ * local_58->m_floats[1])),auVar20._0_16_
                               ,ZEXT416((uint)local_58->m_floats[0]));
      auVar8 = vfmadd231ss_fma(auVar8,auVar22,ZEXT416((uint)local_58->m_floats[2]));
      if (fVar14 < 0.0) {
        fVar13 = sqrtf(fVar14);
        auVar22 = ZEXT416(auVar7._0_4_);
        auVar23 = ZEXT464((uint)fVar16);
        auVar20 = ZEXT464(auVar3._0_4_);
      }
      else {
        auVar3 = vsqrtss_avx(ZEXT416((uint)fVar14),ZEXT416((uint)fVar14));
        fVar13 = auVar3._0_4_;
      }
      pcVar2 = local_98;
      fVar14 = auVar8._0_4_ / fVar14;
      fVar16 = auVar20._0_4_ * fVar14;
      fVar4 = auVar23._0_4_ * fVar14;
      fVar14 = auVar22._0_4_ * fVar14;
      *local_90 = 7;
      fVar15 = local_50->m_floats[0] - fVar16;
      fVar5 = local_50->m_floats[1] - fVar4;
      fVar6 = local_50->m_floats[2] - fVar14;
      auVar22 = vfmsub231ss_fma(ZEXT416((uint)(fVar5 * local_a0)),ZEXT416((uint)local_a4),
                                ZEXT416((uint)fVar6));
      auVar3 = vfmsub231ss_fma(ZEXT416((uint)(fVar6 * local_9c)),ZEXT416((uint)fVar15),
                               ZEXT416((uint)local_a0));
      auVar7 = vfmsub231ss_fma(ZEXT416((uint)(fVar15 * local_a4)),ZEXT416((uint)local_9c),
                               ZEXT416((uint)fVar5));
      auVar22 = vfmadd231ss_fma(ZEXT416((uint)(auVar3._0_4_ * auVar3._0_4_)),auVar22,auVar22);
      auVar22 = vfmadd231ss_fma(auVar22,auVar7,auVar7);
      if (auVar22._0_4_ < 0.0) {
        fVar15 = sqrtf(auVar22._0_4_);
      }
      else {
        auVar22 = vsqrtss_avx(auVar22,auVar22);
        fVar15 = auVar22._0_4_;
      }
      auVar22 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 * fVar4)),ZEXT416((uint)fVar16),
                                ZEXT416((uint)fVar16));
      *w = fVar15 / fVar13;
      fVar16 = pcVar2->m_floats[0] - fVar16;
      fVar4 = pcVar2->m_floats[1] - fVar4;
      fVar15 = pcVar2->m_floats[2] - fVar14;
      auVar3 = vfmsub231ss_fma(ZEXT416((uint)(fVar4 * fStack_60)),ZEXT416((uint)fStack_64),
                               ZEXT416((uint)fVar15));
      auVar7 = vfmsub231ss_fma(ZEXT416((uint)(fVar15 * fStack_68)),ZEXT416((uint)fVar16),
                               ZEXT416((uint)fStack_60));
      auVar8 = vfmsub231ss_fma(ZEXT416((uint)(fVar16 * fStack_64)),ZEXT416((uint)fStack_68),
                               ZEXT416((uint)fVar4));
      auVar3 = vfmadd231ss_fma(ZEXT416((uint)(auVar7._0_4_ * auVar7._0_4_)),auVar3,auVar3);
      auVar3 = vfmadd231ss_fma(auVar3,auVar8,auVar8);
      if (auVar3._0_4_ < 0.0) {
        fVar16 = sqrtf(auVar3._0_4_);
        auVar22 = ZEXT416(auVar22._0_4_);
      }
      else {
        auVar3 = vsqrtss_avx(auVar3,auVar3);
        fVar16 = auVar3._0_4_;
      }
      auVar22 = vfmadd213ss_fma(ZEXT416((uint)fVar14),ZEXT416((uint)fVar14),auVar22);
      cVar21 = auVar22._0_4_;
      w[1] = fVar16 / fVar13;
      w[2] = 1.0 - (fVar16 / fVar13 + *w);
    }
  }
  return cVar21;
}

Assistant:

static cbtScalar projectorigin(const cbtVector3& a,
								  const cbtVector3& b,
								  const cbtVector3& c,
								  cbtScalar* w, U& m)
	{
		static const U imd3[] = {1, 2, 0};
		const cbtVector3* vt[] = {&a, &b, &c};
		const cbtVector3 dl[] = {a - b, b - c, c - a};
		const cbtVector3 n = cbtCross(dl[0], dl[1]);
		const cbtScalar l = n.length2();
		if (l > GJK_SIMPLEX3_EPS)
		{
			cbtScalar mindist = -1;
			cbtScalar subw[2] = {0.f, 0.f};
			U subm(0);
			for (U i = 0; i < 3; ++i)
			{
				if (cbtDot(*vt[i], cbtCross(dl[i], n)) > 0)
				{
					const U j = imd3[i];
					const cbtScalar subd(projectorigin(*vt[i], *vt[j], subw, subm));
					if ((mindist < 0) || (subd < mindist))
					{
						mindist = subd;
						m = static_cast<U>(((subm & 1) ? 1 << i : 0) + ((subm & 2) ? 1 << j : 0));
						w[i] = subw[0];
						w[j] = subw[1];
						w[imd3[j]] = 0;
					}
				}
			}
			if (mindist < 0)
			{
				const cbtScalar d = cbtDot(a, n);
				const cbtScalar s = cbtSqrt(l);
				const cbtVector3 p = n * (d / l);
				mindist = p.length2();
				m = 7;
				w[0] = (cbtCross(dl[1], b - p)).length() / s;
				w[1] = (cbtCross(dl[2], c - p)).length() / s;
				w[2] = 1 - (w[0] + w[1]);
			}
			return (mindist);
		}
		return (-1);
	}